

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdapi_elements_transaction.cpp
# Opt level: O0

void __thiscall
ElementsTransactionApi_EstimateFee_PeginTx2_Test::TestBody
          (ElementsTransactionApi_EstimateFee_PeginTx2_Test *this)

{
  initializer_list<cfd::api::ElementsUtxoAndOption> __l;
  initializer_list<cfd::UtxoData> __l_00;
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  Amount AVar4;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  ElementsTransactionApi api;
  Amount tx_fee;
  Amount utxo_fee;
  Amount calc_fee;
  double effective_fee_rate;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  ConfidentialTransactionContext txc;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  utxos_and_options;
  ElementsUtxoAndOption eutxo1;
  UtxoData utxo1;
  string txoutproof;
  string btc_tx;
  string claim_script;
  string pegin_tx_hex;
  undefined4 in_stack_ffffffffffffe528;
  undefined4 in_stack_ffffffffffffe52c;
  undefined4 in_stack_ffffffffffffe530;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffe534;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffe53c;
  ElementsUtxoAndOption *in_stack_ffffffffffffe540;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *this_00;
  ElementsUtxoAndOption *in_stack_ffffffffffffe548;
  undefined7 in_stack_ffffffffffffe550;
  undefined1 in_stack_ffffffffffffe557;
  string *in_stack_ffffffffffffe558;
  ConfidentialTransactionContext *in_stack_ffffffffffffe560;
  undefined7 in_stack_ffffffffffffe568;
  undefined1 in_stack_ffffffffffffe56f;
  double in_stack_ffffffffffffe570;
  undefined8 in_stack_ffffffffffffe578;
  undefined1 is_blind;
  undefined7 in_stack_ffffffffffffe580;
  undefined1 in_stack_ffffffffffffe587;
  Amount *in_stack_ffffffffffffe588;
  undefined7 in_stack_ffffffffffffe590;
  undefined1 in_stack_ffffffffffffe597;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  *in_stack_ffffffffffffe598;
  UtxoData *in_stack_ffffffffffffe5a0;
  UtxoData *in_stack_ffffffffffffe5a8;
  UtxoData *in_stack_ffffffffffffe5b0;
  int in_stack_ffffffffffffe5e8;
  int in_stack_ffffffffffffe5f0;
  uint32_t **local_19f8;
  undefined8 **local_19d8;
  AssertHelper local_1990;
  Message local_1988;
  undefined4 local_197c;
  int64_t local_1978;
  AssertionResult local_1970;
  AssertHelper local_1960;
  Message local_1958;
  undefined4 local_194c;
  int64_t local_1948;
  AssertionResult local_1940;
  AssertHelper local_1930;
  Message local_1928;
  undefined4 local_191c;
  int64_t local_1918;
  AssertionResult local_1910;
  int64_t local_1900;
  undefined1 local_18f8;
  string local_18f0;
  int64_t local_18d0;
  undefined1 local_18c8;
  ElementsTransactionApi local_18b9;
  Amount local_18b8;
  Amount local_18a8;
  Amount local_1898;
  undefined8 local_1888;
  AssertHelper local_1880;
  Message local_1878 [2];
  undefined1 **local_1868;
  uint32_t *local_1860 [141];
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_ffffffffffffec08;
  ConfidentialTransactionContext *in_stack_ffffffffffffec10;
  undefined1 **local_1338;
  undefined8 local_1330;
  AbstractTransaction local_1310 [14];
  undefined1 **local_1230;
  undefined8 *local_1228 [174];
  undefined1 **local_cb8;
  undefined8 local_cb0;
  Script local_c90 [24];
  undefined1 local_72e;
  undefined4 local_72c;
  Script local_728;
  undefined4 local_6f0;
  allocator local_6e1;
  string local_6e0;
  ConfidentialAssetId local_6c0;
  Amount local_698;
  allocator local_681;
  string local_680;
  Script local_660;
  allocator local_621;
  string local_620;
  Txid local_600;
  undefined8 local_5e0;
  Txid local_5b8;
  undefined4 local_598;
  Script local_590 [8];
  string local_3a0 [32];
  int64_t local_380;
  undefined1 local_378;
  undefined4 local_370;
  undefined8 local_368;
  ConfidentialAssetId local_360 [17];
  allocator local_b1;
  string local_b0 [39];
  allocator local_89;
  string local_88 [39];
  allocator local_61;
  string local_60;
  allocator local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_28,
             "02000000000141fb1b60887f17a4d3351880635ff5e76e7941203348955d2675005892ca343b0000004000ffffffff02016d521c38ec1ea15734ae22b7c46064412829c0d0579f0a713d1c04ede979026f010000000000005e7f001600149aa483fc0fd0b1806f25e57903e4cbefb19c20a1016d521c38ec1ea15734ae22b7c46064412829c0d0579f0a713d1c04ede979026f010000000000000029000000000000"
             ,&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_60,"0014aab2ed7ac90f976a17ddb850c4a0c4e62db49b07",&local_61);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_88,
             "020000000123edd3be8309747693f42e5b6a0a0c57899fca7d6fb5a8d9c4f52fbf7398f03d00000000000000008001a85e00000000000017a914fdfbf873904e8276428aa892576acd028775fbda8700000000"
             ,&local_89);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_b0,
             "0400c0209ac0009d7289eb8e52ef1883501b35ec6ee8a5bfc83a09000000000000000000e157506b8e9b09bed1b9a9d6045fa26735547d696d9ce230c7f2003d09704594f558e160ce981317486c10c46e0600000c7eab9226e14b446023e58c32f677298a3a60448556b3b6dcf189ea680035de47fcd1a47ece1bda2de728f1ea7ca166338ddd0ab1ee2797c7cd2c9c5d5d07b055ed58f3b21f1324c98e1c09a8f4dd3a3f5b3a7ca8efc48fcbcb41cbf5476c40e9e3abc1c5d78e4b59dde0cfabf3c47d68f2f83893b19c0079b6902525c41e146ad09cb3859268063fd6e6b123036e6c65a975698553d701e04f0801752a4c454ff689b184b1c48c3fdfc33a7e25c2d96f8b9dfcbbb6b970f7da7ecbccd6f3d33141fb1b60887f17a4d3351880635ff5e76e7941203348955d2675005892ca343b04b0b4b9206faf789f1c0659f100a69eea88bfdc66a2b2382fe628fb159304ffd3f7ef70acc4e0438b1fb380da205c7ae0746dfbb451bb2110a9a25e224455719c6c22fa85161cb1df6fc4a870b337d2de35c7cc478c6658147ea8e1d64e7152d172e425e8e3ffd1cfae750d09193292f6e170a1fbfd65d8d43ecc3c5e0932fddf4b338fb84ae565a87fb78bc9d4d5d32ab8bf1fba7880c08c3a8a3a7e3aa22803bdd602"
             ,&local_b1);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  cfd::UtxoData::UtxoData(in_stack_ffffffffffffe5a0);
  local_5e0 = 0;
  local_368 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_620,"3b34ca92580075265d9548332041796ee7f55f63801835d3a4177f88601bfb41"
             ,&local_621);
  cfd::core::Txid::Txid(&local_600,&local_620);
  cfd::core::Txid::operator=(&local_5b8,&local_600);
  cfd::core::Txid::~Txid((Txid *)0x2eb584);
  std::__cxx11::string::~string((string *)&local_620);
  std::allocator<char>::~allocator((allocator<char> *)&local_621);
  local_598 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_680,"0014eb3c0d55b7098a4aef4a18ee1eebcb1ed924a82b",&local_681);
  cfd::core::Script::Script(&local_660,&local_680);
  cfd::core::Script::operator=(local_590,&local_660);
  cfd::core::Script::~Script
            ((Script *)CONCAT44(in_stack_ffffffffffffe534,in_stack_ffffffffffffe530));
  std::__cxx11::string::~string((string *)&local_680);
  std::allocator<char>::~allocator((allocator<char> *)&local_681);
  std::__cxx11::string::operator=
            (local_3a0,"wpkh(03f942716865bb9b62678d99aa34de4632249d066d99de2b5a2e542e54908450d6)");
  cfd::core::Amount::Amount(&local_698,0x5ea8);
  local_378 = local_698.ignore_check_;
  local_380 = local_698.amount_;
  local_370 = 4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_6e0,"6f0279e9ed041c3d710a9f57d0c02928416460c4b722ae3457a11eec381c526d"
             ,&local_6e1);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_6c0,&local_6e0);
  cfd::core::ConfidentialAssetId::operator=(local_360,&local_6c0);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x2eb6f2);
  std::__cxx11::string::~string((string *)&local_6e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6e1);
  cfd::api::ElementsUtxoAndOption::ElementsUtxoAndOption(in_stack_ffffffffffffe540);
  cfd::UtxoData::operator=
            ((UtxoData *)CONCAT44(in_stack_ffffffffffffe534,in_stack_ffffffffffffe530),
             (UtxoData *)CONCAT44(in_stack_ffffffffffffe52c,in_stack_ffffffffffffe528));
  local_72e = 1;
  uVar2 = std::__cxx11::string::length();
  local_72c = (undefined4)(uVar2 >> 1);
  uVar2 = std::__cxx11::string::length();
  local_6f0 = (undefined4)(uVar2 >> 1);
  cfd::core::Script::Script(local_c90,&local_60);
  cfd::core::Script::operator=(&local_728,local_c90);
  cfd::core::Script::~Script
            ((Script *)CONCAT44(in_stack_ffffffffffffe534,in_stack_ffffffffffffe530));
  local_1230 = (undefined1 **)local_1228;
  cfd::api::ElementsUtxoAndOption::ElementsUtxoAndOption
            ((ElementsUtxoAndOption *)CONCAT17(in_stack_ffffffffffffe557,in_stack_ffffffffffffe550),
             in_stack_ffffffffffffe548);
  local_cb8 = (undefined1 **)local_1228;
  local_cb0 = 1;
  std::allocator<cfd::api::ElementsUtxoAndOption>::allocator
            ((allocator<cfd::api::ElementsUtxoAndOption> *)0x2eb7f3);
  __l._M_array._7_1_ = in_stack_ffffffffffffe56f;
  __l._M_array._0_7_ = in_stack_ffffffffffffe568;
  __l._M_len = (size_type)in_stack_ffffffffffffe570;
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  vector((vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
          *)in_stack_ffffffffffffe560,__l,(allocator_type *)in_stack_ffffffffffffe558);
  std::allocator<cfd::api::ElementsUtxoAndOption>::~allocator
            ((allocator<cfd::api::ElementsUtxoAndOption> *)0x2eb827);
  local_19d8 = &local_cb8;
  do {
    local_19d8 = local_19d8 + -0xae;
    cfd::api::ElementsUtxoAndOption::~ElementsUtxoAndOption
              ((ElementsUtxoAndOption *)
               CONCAT44(in_stack_ffffffffffffe534,in_stack_ffffffffffffe530));
  } while (local_19d8 != local_1228);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            (in_stack_ffffffffffffe560,in_stack_ffffffffffffe558);
  local_1868 = (undefined1 **)local_1860;
  cfd::UtxoData::UtxoData(in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5a8);
  local_1338 = (undefined1 **)local_1860;
  local_1330 = 1;
  std::allocator<cfd::UtxoData>::allocator((allocator<cfd::UtxoData> *)0x2eb8e5);
  __l_00._M_array._7_1_ = in_stack_ffffffffffffe56f;
  __l_00._M_array._0_7_ = in_stack_ffffffffffffe568;
  __l_00._M_len = (size_type)in_stack_ffffffffffffe570;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)in_stack_ffffffffffffe560,
             __l_00,(allocator_type *)in_stack_ffffffffffffe558);
  std::allocator<cfd::UtxoData>::~allocator((allocator<cfd::UtxoData> *)0x2eb919);
  local_19f8 = (uint32_t **)&local_1338;
  do {
    local_19f8 = local_19f8 + -0xa5;
    cfd::UtxoData::~UtxoData
              ((UtxoData *)CONCAT44(in_stack_ffffffffffffe534,in_stack_ffffffffffffe530));
    is_blind = (undefined1)((ulong)in_stack_ffffffffffffe578 >> 0x38);
  } while (local_19f8 != local_1860);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ConfidentialTransactionContext::CollectInputUtxo
                (in_stack_ffffffffffffec10,in_stack_ffffffffffffec08);
    }
  }
  else {
    testing::Message::Message(local_1878);
    testing::internal::AssertHelper::AssertHelper
              (&local_1880,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x682,
               "Expected: txc.CollectInputUtxo(utxos) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_1880,local_1878);
    testing::internal::AssertHelper::~AssertHelper(&local_1880);
    testing::Message::~Message((Message *)0x2ebebe);
  }
  local_1888 = 0x3fb999999999999a;
  cfd::core::Amount::Amount(&local_1898);
  cfd::core::Amount::Amount(&local_18a8);
  cfd::core::Amount::Amount(&local_18b8);
  cfd::api::ElementsTransactionApi::ElementsTransactionApi(&local_18b9);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_18f0,local_1310);
  this_00 = (vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)0x0;
  uVar6 = 0;
  uVar5 = 0;
  AVar4 = cfd::api::ElementsTransactionApi::EstimateFee
                    ((ElementsTransactionApi *)in_stack_ffffffffffffe5a8,
                     (string *)in_stack_ffffffffffffe5a0,in_stack_ffffffffffffe598,
                     (ConfidentialAssetId *)
                     CONCAT17(in_stack_ffffffffffffe597,in_stack_ffffffffffffe590),
                     in_stack_ffffffffffffe588,
                     (Amount *)CONCAT17(in_stack_ffffffffffffe587,in_stack_ffffffffffffe580),
                     (bool)is_blind,in_stack_ffffffffffffe570,in_stack_ffffffffffffe5e8,
                     in_stack_ffffffffffffe5f0,(uint32_t *)local_19f8);
  local_1900 = AVar4.amount_;
  local_18f8 = AVar4.ignore_check_;
  local_18d0 = local_1900;
  local_18c8 = local_18f8;
  local_1898.amount_ = local_1900;
  local_1898.ignore_check_ = (bool)local_18f8;
  std::__cxx11::string::~string((string *)&local_18f0);
  local_1918 = cfd::core::Amount::GetSatoshiValue(&local_1898);
  local_191c = 0x24;
  testing::internal::EqHelper<false>::Compare<long,int>
            ((char *)in_stack_ffffffffffffe548,(char *)this_00,
             (long *)CONCAT44(in_stack_ffffffffffffe53c,uVar6),
             (int *)CONCAT44(in_stack_ffffffffffffe534,uVar5));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1910);
  if (!bVar1) {
    testing::Message::Message(&local_1928);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2ec10d);
    testing::internal::AssertHelper::AssertHelper
              (&local_1930,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x68c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1930,&local_1928);
    testing::internal::AssertHelper::~AssertHelper(&local_1930);
    testing::Message::~Message((Message *)0x2ec16a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2ec1c2);
  local_1948 = cfd::core::Amount::GetSatoshiValue(&local_18b8);
  local_194c = 0xd;
  testing::internal::EqHelper<false>::Compare<long,int>
            ((char *)in_stack_ffffffffffffe548,(char *)this_00,
             (long *)CONCAT44(in_stack_ffffffffffffe53c,uVar6),
             (int *)CONCAT44(in_stack_ffffffffffffe534,uVar5));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1940);
  if (!bVar1) {
    testing::Message::Message(&local_1958);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2ec284);
    testing::internal::AssertHelper::AssertHelper
              (&local_1960,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x68d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1960,&local_1958);
    testing::internal::AssertHelper::~AssertHelper(&local_1960);
    testing::Message::~Message((Message *)0x2ec2e1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2ec339);
  local_1978 = cfd::core::Amount::GetSatoshiValue(&local_18a8);
  local_197c = 0x18;
  testing::internal::EqHelper<false>::Compare<long,int>
            ((char *)in_stack_ffffffffffffe548,(char *)this_00,
             (long *)CONCAT44(in_stack_ffffffffffffe53c,uVar6),
             (int *)CONCAT44(in_stack_ffffffffffffe534,uVar5));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1970);
  if (!bVar1) {
    testing::Message::Message(&local_1988);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2ec3fb);
    testing::internal::AssertHelper::AssertHelper
              (&local_1990,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x68e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1990,&local_1988);
    testing::internal::AssertHelper::~AssertHelper(&local_1990);
    testing::Message::~Message((Message *)0x2ec458);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2ec4b0);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(this_00);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)CONCAT44(in_stack_ffffffffffffe534,uVar5));
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  ~vector((vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
           *)this_00);
  cfd::api::ElementsUtxoAndOption::~ElementsUtxoAndOption
            ((ElementsUtxoAndOption *)CONCAT44(in_stack_ffffffffffffe534,uVar5));
  cfd::UtxoData::~UtxoData((UtxoData *)CONCAT44(in_stack_ffffffffffffe534,uVar5));
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

TEST(ElementsTransactionApi, EstimateFee_PeginTx2) {
  // signed pegin tx
  std::string pegin_tx_hex = "02000000000141fb1b60887f17a4d3351880635ff5e76e7941203348955d2675005892ca343b0000004000ffffffff02016d521c38ec1ea15734ae22b7c46064412829c0d0579f0a713d1c04ede979026f010000000000005e7f001600149aa483fc0fd0b1806f25e57903e4cbefb19c20a1016d521c38ec1ea15734ae22b7c46064412829c0d0579f0a713d1c04ede979026f010000000000000029000000000000";
  std::string claim_script = "0014aab2ed7ac90f976a17ddb850c4a0c4e62db49b07";
  std::string btc_tx = "020000000123edd3be8309747693f42e5b6a0a0c57899fca7d6fb5a8d9c4f52fbf7398f03d00000000000000008001a85e00000000000017a914fdfbf873904e8276428aa892576acd028775fbda8700000000";
  std::string txoutproof = "0400c0209ac0009d7289eb8e52ef1883501b35ec6ee8a5bfc83a09000000000000000000e157506b8e9b09bed1b9a9d6045fa26735547d696d9ce230c7f2003d09704594f558e160ce981317486c10c46e0600000c7eab9226e14b446023e58c32f677298a3a60448556b3b6dcf189ea680035de47fcd1a47ece1bda2de728f1ea7ca166338ddd0ab1ee2797c7cd2c9c5d5d07b055ed58f3b21f1324c98e1c09a8f4dd3a3f5b3a7ca8efc48fcbcb41cbf5476c40e9e3abc1c5d78e4b59dde0cfabf3c47d68f2f83893b19c0079b6902525c41e146ad09cb3859268063fd6e6b123036e6c65a975698553d701e04f0801752a4c454ff689b184b1c48c3fdfc33a7e25c2d96f8b9dfcbbb6b970f7da7ecbccd6f3d33141fb1b60887f17a4d3351880635ff5e76e7941203348955d2675005892ca343b04b0b4b9206faf789f1c0659f100a69eea88bfdc66a2b2382fe628fb159304ffd3f7ef70acc4e0438b1fb380da205c7ae0746dfbb451bb2110a9a25e224455719c6c22fa85161cb1df6fc4a870b337d2de35c7cc478c6658147ea8e1d64e7152d172e425e8e3ffd1cfae750d09193292f6e170a1fbfd65d8d43ecc3c5e0932fddf4b338fb84ae565a87fb78bc9d4d5d32ab8bf1fba7880c08c3a8a3a7e3aa22803bdd602";

  // Address1
  UtxoData utxo1;
  utxo1.block_height = 0;
  utxo1.binary_data = nullptr;
  utxo1.txid = Txid("3b34ca92580075265d9548332041796ee7f55f63801835d3a4177f88601bfb41");
  utxo1.vout = 0;
  utxo1.locking_script = Script("0014eb3c0d55b7098a4aef4a18ee1eebcb1ed924a82b");
  utxo1.descriptor = "wpkh(03f942716865bb9b62678d99aa34de4632249d066d99de2b5a2e542e54908450d6)";
  utxo1.amount = Amount(int64_t{24232});
  utxo1.address_type = AddressType::kP2wpkhAddress;
  utxo1.asset = ConfidentialAssetId("6f0279e9ed041c3d710a9f57d0c02928416460c4b722ae3457a11eec381c526d");
  ElementsUtxoAndOption eutxo1;
  eutxo1.utxo = utxo1;
  eutxo1.is_pegin = true;
  eutxo1.pegin_btc_tx_size = btc_tx.length() / 2;
  eutxo1.pegin_txoutproof_size = txoutproof.length() / 2;
  eutxo1.claim_script = Script(claim_script);
  std::vector<cfd::api::ElementsUtxoAndOption> utxos_and_options{
      eutxo1
  };

  ConfidentialTransactionContext txc(pegin_tx_hex);

  std::vector<cfd::UtxoData> utxos{utxo1};
  EXPECT_NO_THROW(txc.CollectInputUtxo(utxos));

  // check estimateFee
  double effective_fee_rate = 0.1;
  Amount calc_fee;
  Amount utxo_fee;
  Amount tx_fee;
  ElementsTransactionApi api;
  calc_fee = api.EstimateFee(txc.GetHex(), utxos_and_options, utxo1.asset,
      &tx_fee, &utxo_fee, false, effective_fee_rate, 0, 0);
  EXPECT_EQ(calc_fee.GetSatoshiValue(), 36);
  EXPECT_EQ(tx_fee.GetSatoshiValue(), 13);
  EXPECT_EQ(utxo_fee.GetSatoshiValue(), 24);
}